

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.h
# Opt level: O3

FSerializer *
Serialize<FLinkedSector,FLinkedSector>
          (FSerializer *arc,char *key,TArray<FLinkedSector,_FLinkedSector> *value,
          TArray<FLinkedSector,_FLinkedSector> *param_4)

{
  bool bVar1;
  uint uVar2;
  uint amount;
  ulong uVar3;
  long lVar4;
  
  if ((arc->w == (FWriter *)0x0) || (value->Count != 0)) {
    bVar1 = FSerializer::BeginArray(arc,key);
    if (arc->r == (FReader *)0x0) {
      uVar2 = value->Count;
    }
    else {
      if (!bVar1) {
        if (value->Count == 0) {
          return arc;
        }
        value->Count = 0;
        return arc;
      }
      uVar2 = FSerializer::ArraySize(arc);
      amount = uVar2 - value->Count;
      if (value->Count <= uVar2 && amount != 0) {
        TArray<FLinkedSector,_FLinkedSector>::Grow(value,amount);
      }
      value->Count = uVar2;
    }
    if (uVar2 != 0) {
      lVar4 = 0;
      uVar3 = 0;
      do {
        Serialize(arc,(char *)0x0,(FLinkedSector *)((long)&value->Array->Sector + lVar4),
                  (FLinkedSector *)param_4);
        uVar3 = uVar3 + 1;
        lVar4 = lVar4 + 0x10;
      } while (uVar3 < value->Count);
    }
    FSerializer::EndArray(arc);
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, TArray<T, TT> &value, TArray<T, TT> *)
{
	if (arc.isWriting())
	{
		if (value.Size() == 0) return arc;	// do not save empty arrays
	}
	bool res = arc.BeginArray(key);
	if (arc.isReading())
	{
		if (!res)
		{
			value.Clear();
			return arc;
		}
		value.Resize(arc.ArraySize());
	}
	for (unsigned i = 0; i < value.Size(); i++)
	{
		Serialize(arc, nullptr, value[i], (T*)nullptr);
	}
	arc.EndArray();
	return arc;
}